

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O2

void __thiscall
ChunkedSequenceResize_ThreeElementsDownToZero_Test::
ChunkedSequenceResize_ThreeElementsDownToZero_Test
          (ChunkedSequenceResize_ThreeElementsDownToZero_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002222a8;
  return;
}

Assistant:

TEST (ChunkedSequenceResize, ThreeElementsDownToZero) {
    cseq_int cs;
    cs.emplace_back (37);
    cs.emplace_back (41);
    cs.emplace_back (43);
    // Before: [ 37, 41 ] -> [ 43, _ ]
    EXPECT_EQ (cs.chunks_size (), 2U);
    // After: [ _, _ ]
    cs.resize (0U);
    EXPECT_EQ (cs.chunks_size (), 1U);
    EXPECT_EQ (cs.size (), 0U);
    EXPECT_EQ (std::distance (std::begin (cs), std::end (cs)), 0U);
    EXPECT_EQ (cs.capacity (), 2U);
    EXPECT_TRUE (cs.empty ());
}